

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

errr finish_parse_pit(parser *p)

{
  ushort uVar1;
  pit_profile *ppVar2;
  long *plVar3;
  undefined8 *p_00;
  long lVar4;
  uint16_t uVar5;
  long lVar6;
  undefined8 *puVar7;
  bitflag *pbVar8;
  ulong uVar9;
  byte bVar10;
  
  bVar10 = 0;
  z_info->pit_max = 0;
  plVar3 = (long *)parser_priv(p);
  if (plVar3 != (long *)0x0) {
    uVar5 = z_info->pit_max;
    do {
      uVar5 = uVar5 + 1;
      plVar3 = (long *)*plVar3;
    } while (plVar3 != (long *)0x0);
    z_info->pit_max = uVar5;
  }
  pit_info = (pit_profile *)mem_zalloc((ulong)z_info->pit_max * 0x78 + 0x78);
  uVar1 = z_info->pit_max;
  p_00 = (undefined8 *)parser_priv(p);
  if (p_00 != (undefined8 *)0x0) {
    lVar6 = (ulong)uVar1 * 0x78;
    uVar9 = (ulong)uVar1;
    do {
      if ((long)uVar9 < 1) {
        __assert_fail("pit_idx >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                      ,0x9be,"errr finish_parse_pit(struct parser *)");
      }
      puVar7 = p_00;
      pbVar8 = pit_info[-1].flags + lVar6 + -0x28;
      for (lVar4 = 0xf; ppVar2 = pit_info, lVar4 != 0; lVar4 = lVar4 + -1) {
        *(undefined8 *)pbVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
        pbVar8 = pbVar8 + ((ulong)bVar10 * -2 + 1) * 8;
      }
      pbVar8 = pit_info->flags;
      *(int *)((long)pit_info + lVar6 + -0x70) = (int)(uVar9 - 1);
      puVar7 = (undefined8 *)*p_00;
      pbVar8 = pbVar8 + lVar6 + -0x28;
      if ((long)(ulong)z_info->pit_max <= (long)uVar9) {
        pbVar8 = (bitflag *)0x0;
      }
      *(bitflag **)(ppVar2[-1].flags + lVar6 + -0x28) = pbVar8;
      mem_free(p_00);
      p_00 = puVar7;
      lVar6 = lVar6 + -0x78;
      uVar9 = uVar9 - 1;
    } while (puVar7 != (undefined8 *)0x0);
  }
  z_info->pit_max = z_info->pit_max + 1;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_pit(struct parser *p) {
	struct pit_profile *pit, *n;
	int pit_idx;
		
	/* Scan the list for the max id */
	z_info->pit_max = 0;
	pit = parser_priv(p);
	while (pit) {
		z_info->pit_max++;
		pit = pit->next;
	}

	/* Allocate the direct access list and copy the data to it */
	pit_info = mem_zalloc((z_info->pit_max + 1) * sizeof(*pit));
	pit_idx = z_info->pit_max - 1;
	for (pit = parser_priv(p); pit; pit = n, pit_idx--) {
		assert(pit_idx >= 0);

		memcpy(&pit_info[pit_idx], pit, sizeof(*pit));
		pit_info[pit_idx].pit_idx = pit_idx;
		n = pit->next;
		if (pit_idx < z_info->pit_max - 1)
			pit_info[pit_idx].next = &pit_info[pit_idx + 1];
		else
			pit_info[pit_idx].next = NULL;

		mem_free(pit);
	}
	z_info->pit_max += 1;

	parser_destroy(p);
	return 0;
}